

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

_Bool content_type_match(char *contenttype,char *target,size_t len)

{
  int iVar1;
  size_t len_local;
  char *target_local;
  char *contenttype_local;
  
  if (((contenttype == (char *)0x0) || (iVar1 = curl_strnequal(contenttype,target,len), iVar1 == 0))
     || (((iVar1 = (int)contenttype[len], contenttype[len] != '\0' &&
          (((1 < iVar1 - 9U && (iVar1 != 0xd)) && (iVar1 != 0x20)))) && (iVar1 != 0x3b)))) {
    contenttype_local._7_1_ = false;
  }
  else {
    contenttype_local._7_1_ = true;
  }
  return contenttype_local._7_1_;
}

Assistant:

static bool content_type_match(const char *contenttype,
                               const char *target, size_t len)
{
  if(contenttype && strncasecompare(contenttype, target, len))
    switch(contenttype[len]) {
    case '\0':
    case '\t':
    case '\r':
    case '\n':
    case ' ':
    case ';':
      return TRUE;
    }
  return FALSE;
}